

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::multisample::
MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateBarycentricCoordinates>::
uploadVertexData(MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateBarycentricCoordinates>
                 *this,Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton)

{
  pointer __src;
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  vertices;
  _Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  local_68;
  Vec3 local_50;
  VertexDataNdcBarycentric local_44;
  Vec4 local_28;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.m_data[0] = -1.0;
  local_28.m_data[1] = -1.0;
  local_28.m_data[2] = 0.0;
  local_28.m_data[3] = 1.0;
  local_50.m_data[0] = 0.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 1.0;
  VertexDataNdcBarycentric::VertexDataNdcBarycentric(&local_44,&local_28,&local_50);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcBarycentric>
            ((vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
              *)&local_68,&local_44);
  local_28.m_data[0] = -1.0;
  local_28.m_data[1] = 1.0;
  local_28.m_data[2] = 0.0;
  local_28.m_data[3] = 1.0;
  local_50.m_data[0] = 1.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  VertexDataNdcBarycentric::VertexDataNdcBarycentric(&local_44,&local_28,&local_50);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcBarycentric>
            ((vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
              *)&local_68,&local_44);
  local_28.m_data[0] = 1.0;
  local_28.m_data[1] = -1.0;
  local_28.m_data[2] = 0.0;
  local_28.m_data[3] = 1.0;
  local_50.m_data[0] = 0.0;
  local_50.m_data[1] = 1.0;
  local_50.m_data[2] = 0.0;
  VertexDataNdcBarycentric::VertexDataNdcBarycentric(&local_44,&local_28,&local_50);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcBarycentric>
            ((vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
              *)&local_68,&local_44);
  __src = (pointer)0x0;
  if (local_68._M_impl.super__Vector_impl_data._M_finish !=
      local_68._M_impl.super__Vector_impl_data._M_start) {
    __src = local_68._M_impl.super__Vector_impl_data._M_start;
  }
  memcpy(vertexBufferAllocation->m_hostPtr,__src,vertexDataDescripton->dataSize);
  std::
  _Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::~_Vector_base(&local_68);
  return;
}

Assistant:

void MSInstance<MSInstanceInterpolateBarycentricCoordinates>::uploadVertexData (const Allocation& vertexBufferAllocation, const VertexDataDesc& vertexDataDescripton) const
{
	// Create buffer storing vertex data
	std::vector<VertexDataNdcBarycentric> vertices;

	vertices.push_back(VertexDataNdcBarycentric(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec3(0.0f, 0.0f, 1.0f)));
	vertices.push_back(VertexDataNdcBarycentric(tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec3(1.0f, 0.0f, 0.0f)));
	vertices.push_back(VertexDataNdcBarycentric(tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec3(0.0f, 1.0f, 0.0f)));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}